

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraKateGenerator.cxx
# Opt level: O2

string * __thiscall
cmExtraKateGenerator::GenerateProjectName
          (string *__return_storage_ptr__,cmExtraKateGenerator *this,string *name,string *type,
          string *path)

{
  char *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  __rhs = "-";
  if (type->_M_string_length == 0) {
    __rhs = "";
  }
  std::operator+(&local_40,name,__rhs);
  std::operator+(&local_80,&local_40,type);
  std::operator+(&local_60,&local_80,'@');
  std::operator+(__return_storage_ptr__,&local_60,path);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraKateGenerator::GenerateProjectName(
  const std::string& name, const std::string& type,
  const std::string& path) const
{
  return name + (type.empty() ? "" : "-") + type + '@' + path;
}